

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O2

Vector __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getMomentaDotFromKinematics
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  Vector *u;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar1;
  long *in_RSI;
  Vector VVar2;
  Vector6 v;
  void *local_58 [6];
  
  if ((char)in_RSI[0x2d0] == '\x01') {
    u = (Vector *)(**(code **)(*in_RSI + 0x80))();
    (**(code **)(*in_RSI + 0x70))(local_58);
    IMUElasticLocalFrameDynamicalSystem::getMomentaDotFromKinematics
              ((IMUElasticLocalFrameDynamicalSystem *)this,(Vector *)(in_RSI + 0x6c),u);
    free(local_58[0]);
    IVar1 = extraout_RDX;
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_58);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_58);
    IVar1 = extraout_RDX_00;
  }
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar1;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector ModelBaseEKFFlexEstimatorIMU::getMomentaDotFromKinematics()
{
  if(on_ == true)
  {
    return functor_.getMomentaDotFromKinematics(getFlexibilityVector(), getInput());
  }
  else
  {
    Vector6 v;
    v.setZero();
    return v;
  }
}